

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O3

void av1_free_pmc(PICK_MODE_CONTEXT *ctx,int num_planes)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  
  if (ctx != (PICK_MODE_CONTEXT *)0x0) {
    aom_free(ctx->blk_skip);
    ctx->blk_skip = (uint8_t *)0x0;
    aom_free(ctx->tx_type_map);
    if (0 < num_planes) {
      uVar3 = 0;
      do {
        ctx->coeff[uVar3] = (tran_low_t *)0x0;
        ctx->qcoeff[uVar3] = (tran_low_t *)0x0;
        ctx->dqcoeff[uVar3] = (tran_low_t *)0x0;
        aom_free(ctx->eobs[uVar3]);
        ctx->eobs[uVar3] = (uint16_t *)0x0;
        aom_free(ctx->txb_entropy_ctx[uVar3]);
        ctx->txb_entropy_ctx[uVar3] = (uint8_t *)0x0;
        uVar3 = uVar3 + 1;
      } while ((uint)num_planes != uVar3);
    }
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      if (ctx->color_index_map[lVar4] != (uint8_t *)0x0) {
        aom_free(ctx->color_index_map[lVar4]);
        ctx->color_index_map[lVar4] = (uint8_t *)0x0;
      }
      lVar4 = 1;
      bVar1 = false;
    } while (bVar2);
    aom_free(ctx);
    return;
  }
  return;
}

Assistant:

void av1_free_pmc(PICK_MODE_CONTEXT *ctx, int num_planes) {
  if (ctx == NULL) return;

  aom_free(ctx->blk_skip);
  ctx->blk_skip = NULL;
  aom_free(ctx->tx_type_map);
  for (int i = 0; i < num_planes; ++i) {
    ctx->coeff[i] = NULL;
    ctx->qcoeff[i] = NULL;
    ctx->dqcoeff[i] = NULL;
    aom_free(ctx->eobs[i]);
    ctx->eobs[i] = NULL;
    aom_free(ctx->txb_entropy_ctx[i]);
    ctx->txb_entropy_ctx[i] = NULL;
  }

  for (int i = 0; i < 2; ++i) {
    if (ctx->color_index_map[i]) {
      aom_free(ctx->color_index_map[i]);
      ctx->color_index_map[i] = NULL;
    }
  }

  aom_free(ctx);
}